

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost89_set_asn1_parameters(EVP_CIPHER_CTX *ctx,ASN1_TYPE *params)

{
  int iVar1;
  int *piVar2;
  GOST_CIPHER_PARAMS *a;
  GOST_CIPHER_PARAMS *a_00;
  ASN1_OBJECT *pAVar3;
  uchar *data;
  ASN1_OCTET_STRING *str;
  ASN1_TYPE *in_RSI;
  undefined8 in_RDI;
  ASN1_OCTET_STRING *os;
  GOST_CIPHER_PARAMS *gcp;
  ossl_gost_cipher_ctx *c;
  uchar *p;
  uchar *buf;
  int len;
  char *in_stack_ffffffffffffffa8;
  ASN1_OCTET_STRING *str_00;
  undefined8 in_stack_ffffffffffffffb0;
  uchar **out;
  
  piVar2 = (int *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  a = GOST_CIPHER_PARAMS_new();
  out = (uchar **)0x0;
  if (a == (GOST_CIPHER_PARAMS *)0x0) {
    ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8,0);
  }
  else {
    str_00 = a->iv;
    a_00 = (GOST_CIPHER_PARAMS *)EVP_CIPHER_CTX_iv(in_RDI);
    iVar1 = EVP_CIPHER_CTX_get_iv_length(in_RDI);
    iVar1 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)str_00,(uchar *)a_00,iVar1);
    if (iVar1 == 0) {
      GOST_CIPHER_PARAMS_free(a_00);
      ERR_GOST_error((int)((ulong)a_00 >> 0x20),(int)a_00,(char *)str_00,0);
    }
    else {
      ASN1_OBJECT_free((ASN1_OBJECT *)a->enc_param_set);
      pAVar3 = OBJ_nid2obj(*piVar2);
      a->enc_param_set = (ASN1_OBJECT *)pAVar3;
      iVar1 = i2d_GOST_CIPHER_PARAMS(a,out);
      data = (uchar *)CRYPTO_malloc(iVar1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                                    ,0x56f);
      if (data == (uchar *)0x0) {
        GOST_CIPHER_PARAMS_free(a_00);
        ERR_GOST_error((int)((ulong)a_00 >> 0x20),(int)a_00,(char *)str_00,0);
      }
      else {
        i2d_GOST_CIPHER_PARAMS(a,out);
        GOST_CIPHER_PARAMS_free(a_00);
        str = ASN1_OCTET_STRING_new();
        if ((str != (ASN1_OCTET_STRING *)0x0) &&
           (iVar1 = ASN1_OCTET_STRING_set(str,data,iVar1), iVar1 != 0)) {
          CRYPTO_free(data);
          ASN1_TYPE_set(in_RSI,0x10,str);
          return 1;
        }
        CRYPTO_free(data);
        ERR_GOST_error((int)((ulong)a_00 >> 0x20),(int)a_00,(char *)str_00,0);
      }
    }
  }
  return 0;
}

Assistant:

static int gost89_set_asn1_parameters(EVP_CIPHER_CTX *ctx, ASN1_TYPE *params)
{
    int len = 0;
    unsigned char *buf = NULL;
    unsigned char *p = NULL;
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
    GOST_CIPHER_PARAMS *gcp = GOST_CIPHER_PARAMS_new();
    ASN1_OCTET_STRING *os = NULL;
    if (!gcp) {
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    if (!ASN1_OCTET_STRING_set
        (gcp->iv, EVP_CIPHER_CTX_iv(ctx), EVP_CIPHER_CTX_iv_length(ctx))) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    ASN1_OBJECT_free(gcp->enc_param_set);
    gcp->enc_param_set = OBJ_nid2obj(c->paramNID);

    len = i2d_GOST_CIPHER_PARAMS(gcp, NULL);
    p = buf = OPENSSL_malloc(len);
    if (!buf) {
        GOST_CIPHER_PARAMS_free(gcp);
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    i2d_GOST_CIPHER_PARAMS(gcp, &p);
    GOST_CIPHER_PARAMS_free(gcp);

    os = ASN1_OCTET_STRING_new();

    if (!os || !ASN1_OCTET_STRING_set(os, buf, len)) {
        OPENSSL_free(buf);
        GOSTerr(GOST_F_GOST89_SET_ASN1_PARAMETERS, ERR_R_MALLOC_FAILURE);
        return 0;
    }
    OPENSSL_free(buf);

    ASN1_TYPE_set(params, V_ASN1_SEQUENCE, os);
    return 1;
}